

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

UInt128 __thiscall clickhouse::ColumnUUID::operator[](ColumnUUID *this,size_t n)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  UInt128 UVar3;
  
  puVar1 = ColumnVector<unsigned_long>::operator[]
                     ((this->data_).
                      super___shared_ptr<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,n * 2);
  puVar2 = ColumnVector<unsigned_long>::operator[]
                     ((this->data_).
                      super___shared_ptr<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,n * 2 + 1);
  UVar3.second = *puVar2;
  UVar3.first = *puVar1;
  return UVar3;
}

Assistant:

const UInt128 ColumnUUID::operator [] (size_t n) const {
    return UInt128((*data_)[n * 2], (*data_)[n * 2 + 1]);
}